

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set_value.c
# Opt level: O3

int valueConvert(mpt_convertable *conv,mpt_type_t type,void *ptr)

{
  _func_int_mpt_convertable_ptr_mpt_type_t_void_ptr *p_Var1;
  _func_int_mpt_convertable_ptr_mpt_type_t_void_ptr *type_00;
  _mpt_vptr_convertable *p_Var2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  mpt_data_converter_t p_Var6;
  mpt_type_traits *pmVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  _func_int_mpt_convertable_ptr_mpt_type_t_void_ptr *p_Stack_30;
  
  p_Var2 = conv[1]._vptr;
  if (type == 0x19) {
    if (ptr != (void *)0x0) {
      p_Var1 = p_Var2[1].convert;
      *(_func_int_mpt_convertable_ptr_mpt_type_t_void_ptr **)ptr = p_Var2->convert;
      *(_func_int_mpt_convertable_ptr_mpt_type_t_void_ptr **)((long)ptr + 8) = p_Var1;
    }
    return 0x19;
  }
  if (type == 0) {
    if (ptr != (void *)0x0) {
      *(uint8_t **)ptr = "\x19";
    }
    return *(int *)&p_Var2[1].convert;
  }
  p_Var1 = p_Var2->convert;
  iVar10 = -1;
  if (type != 0) {
    p_Stack_30 = p_Var1;
    p_Var6 = mpt_data_converter((mpt_type_t)p_Var2[1].convert);
    if ((p_Var6 != (mpt_data_converter_t)0x0) && (iVar4 = (*p_Var6)(p_Var1,type,ptr), -1 < iVar4)) {
      return (uint)(p_Var2[1].convert != (_func_int_mpt_convertable_ptr_mpt_type_t_void_ptr *)type)
             * 3;
    }
    type_00 = p_Var2[1].convert;
    if (type_00 == (_func_int_mpt_convertable_ptr_mpt_type_t_void_ptr *)type) {
      pmVar7 = mpt_type_traits(type);
      if (((pmVar7 != (mpt_type_traits *)0x0) &&
          (iVar10 = -2, pmVar7->init == (_func_int_void_ptr_void_ptr *)0x0)) &&
         (pmVar7->fini == (_func_void_void_ptr *)0x0)) {
        iVar10 = 0;
        if (ptr != (void *)0x0) {
          memcpy(ptr,p_Var1,pmVar7->size);
          iVar10 = 0;
        }
      }
    }
    else {
      if (type == 0x40) {
        uVar5 = 0;
        if (type_00 + -0x40 < (code *)0x1a) {
          uVar5 = (int)type_00 + 0x20;
        }
        if (0 < (int)uVar5) {
          pmVar7 = mpt_type_traits((ulong)uVar5);
          if (pmVar7 == (mpt_type_traits *)0x0) {
            return -1;
          }
          if (pmVar7->init != (_func_int_void_ptr_void_ptr *)0x0) {
            return -2;
          }
          if (pmVar7->fini != (_func_void_void_ptr *)0x0) {
            return -2;
          }
          if (ptr == (void *)0x0) {
            return 1;
          }
          uVar3 = *(undefined8 *)(p_Var1 + 8);
          *(undefined8 *)ptr = *(undefined8 *)p_Var1;
          *(undefined8 *)((long)ptr + 8) = uVar3;
          return 1;
        }
      }
      uVar9 = 0;
      if (type_00 + -0x60 < (code *)0x1b) {
        uVar9 = (ulong)((int)type_00 + 0xe0U & 0xff);
      }
      if (uVar9 == type) {
        pmVar7 = mpt_type_traits((mpt_type_t)type_00);
        if ((pmVar7 != (mpt_type_traits *)0x0) && (iVar10 = 2, ptr != (void *)0x0)) {
          *(_func_int_mpt_convertable_ptr_mpt_type_t_void_ptr **)ptr = p_Var1;
          *(size_t *)((long)ptr + 8) = pmVar7->size;
        }
      }
      else {
        iVar10 = -3;
        if (((type == 0x73) &&
            (pcVar8 = mpt_data_tostring(&p_Stack_30,(mpt_type_t)type_00,(size_t *)0x0),
            pcVar8 != (char *)0x0)) && (iVar10 = 4, ptr != (void *)0x0)) {
          *(char **)ptr = pcVar8;
        }
      }
    }
  }
  return iVar10;
}

Assistant:

static int valueConvert(MPT_INTERFACE(convertable) *conv, MPT_TYPE(type) type, void *ptr)
{
	const MPT_STRUCT(value) *val = *((void **) (conv + 1));
	
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeValue), 0 };
		if (ptr) *((const uint8_t **) ptr) = fmt;
		return val->_type;
	}
	/* verbatim value assignment */
	if (type == MPT_ENUM(TypeValue)) {
		if (ptr) {
			memcpy(ptr, val, sizeof(*val));
		}
		return type;
	}
	return mpt_value_convert(val, type, ptr);
}